

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_example.cpp
# Opt level: O0

void getdir(string *dir,
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *files)

{
  DIR *this;
  char *pcVar1;
  ostream *poVar2;
  int *piVar3;
  allocator local_49;
  string local_48 [32];
  dirent *local_28;
  dirent *dirp;
  DIR *dp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *dir_local;
  
  dp = (DIR *)files;
  files_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)dir;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  dirp = (dirent *)opendir(pcVar1);
  if (dirp == (dirent *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error(");
    piVar3 = __errno_location();
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar3);
    poVar2 = std::operator<<(poVar2,") opening ");
    poVar2 = std::operator<<(poVar2,(string *)dir);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  while (local_28 = readdir((DIR *)dirp), this = dp, local_28 != (dirent *)0x0) {
    pcVar1 = local_28->d_name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar1,&local_49);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,(value_type *)local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  closedir((DIR *)dirp);
  return;
}

Assistant:

void getdir (std::string dir, std::vector<std::string> &files)
{
    DIR *dp;
    struct dirent *dirp;
    if((dp  = opendir(dir.c_str())) == NULL) {
        std::cout << "Error(" << errno << ") opening " << dir << std::endl;
    }

    while ((dirp = readdir(dp)) != NULL) {
        files.push_back(std::string(dirp->d_name));
    }
    closedir(dp);
}